

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::microfacet::g2(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float fVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  undefined8 local_38;
  float local_30;
  
  fVar1 = 0.0;
  if (0.0 < wm->z) {
    fVar1 = 0.0;
    if ((0.0 < wi->z) && (0.0 < wo->z)) {
      fVar1 = wi->z * wo->z;
      vVar7 = djb::operator*(&args->minv,wi);
      local_30 = vVar7.z;
      fVar2 = vVar7.x;
      fVar3 = vVar7.y;
      fVar5 = SQRT(local_30 * local_30 + fVar2 * fVar2 + fVar3 * fVar3);
      fVar4 = 1.0 / fVar5;
      local_30 = local_30 * fVar4;
      local_38 = CONCAT44(fVar4 * fVar3,fVar4 * fVar2);
      (*(this->super_brdf)._vptr_brdf[10])(this,&local_38);
      vVar7 = djb::operator*(&args->minv,wo);
      local_30 = vVar7.z;
      fVar2 = vVar7.x;
      fVar3 = vVar7.y;
      fVar6 = SQRT(local_30 * local_30 + fVar2 * fVar2 + fVar3 * fVar3);
      fVar4 = 1.0 / fVar6;
      local_30 = local_30 * fVar4;
      local_38 = CONCAT44(fVar4 * fVar3,fVar4 * fVar2);
      (*(this->super_brdf)._vptr_brdf[10])(this,&local_38);
      fVar1 = fVar1 / ((extraout_XMM0_Da * fVar5 * wo->z + extraout_XMM0_Da_00 * fVar6 * wi->z) -
                      fVar1);
    }
  }
  return fVar1;
}

Assistant:

float_t
microfacet::g2(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t zizo = wi.z * wo.z;
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		return zizo / (sigma_i * wo.z + sigma_o * wi.z - zizo);
	}
	return 0;
}